

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetSubjectCount(VClient *this,uint *o_rSubjectCount)

{
  Enum EVar1;
  bool bVar2;
  Enum GetResult;
  scoped_lock Lock;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  GetResult = Success;
  bVar2 = InitGet<unsigned_int>(this,&GetResult,o_rSubjectCount);
  EVar1 = GetResult;
  if (bVar2) {
    *o_rSubjectCount =
         (uint)(((long)(this->m_LatestFrame).m_Subjects.
                       super__Vector_base<ViconCGStream::VSubjectInfo,_std::allocator<ViconCGStream::VSubjectInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_LatestFrame).m_Subjects.
                      super__Vector_base<ViconCGStream::VSubjectInfo,_std::allocator<ViconCGStream::VSubjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x78);
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetSubjectCount( unsigned int & o_rSubjectCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult, o_rSubjectCount ) )
  {
    o_rSubjectCount = static_cast< unsigned int >( m_LatestFrame.m_Subjects.size() );
  }

  return GetResult;
}